

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

ParseArgumentStatus __thiscall
google::protobuf::compiler::CommandLineInterface::ParseArguments
          (CommandLineInterface *this,int argc,char **argv)

{
  reference ppVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  ParseArgumentStatus PVar5;
  ostream *poVar6;
  size_type sVar7;
  char *pcVar8;
  reference pvVar9;
  ctrl_t *pcVar10;
  LogMessage *pLVar11;
  ulong uVar12;
  AlphaNum *b;
  char *in_R9;
  iterator iVar13;
  undefined1 auVar14 [16];
  string_view plugin_prefix;
  string_view directive;
  bool local_3b9;
  bool local_362;
  LogMessage local_288;
  Voidify local_272;
  bool local_271;
  undefined1 local_270 [7];
  bool missing_proto_definitions;
  string local_230 [39];
  byte local_209;
  AlphaNum local_208;
  AlphaNum local_1d8;
  string local_1a8;
  ctrl_t *local_188;
  size_t local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [8];
  string plugin_name;
  OutputDirective *d;
  iterator __end3;
  iterator __begin3;
  vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
  *__range3;
  undefined1 auStack_120 [7];
  bool foundImplicitPlugin;
  anon_union_8_1_a8a14541_for_iterator_2 local_118;
  iterator local_110;
  reference local_100;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *kv;
  iterator __end2;
  iterator __begin2;
  flat_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  undefined1 local_c8 [3];
  bool foundUnknownPluginOption;
  ParseArgumentStatus status;
  string value;
  string name;
  size_t i_1;
  value_type local_78;
  int local_58;
  int local_44;
  undefined1 local_40 [4];
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arguments;
  char **argv_local;
  int argc_local;
  CommandLineInterface *this_local;
  
  arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::__cxx11::string::operator=((string *)this,*argv);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40);
  for (local_44 = 1; local_44 < argc; local_44 = local_44 + 1) {
    if (**(char **)(&(arguments.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus +
                   (long)local_44 * 8) == '@') {
      bVar2 = ExpandArgumentFile(this,(char *)(*(long *)(&(arguments.
                                                                                                                      
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus + (long)local_44 * 8) + 1),
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_40);
      if (!bVar2) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Failed to open argument file: ");
        poVar6 = std::operator<<(poVar6,(char *)(*(long *)(&(arguments.
                                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->_M_dataplus + (long)local_44 * 8) + 1));
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        this_local._4_4_ = PARSE_ARGUMENT_FAIL;
        local_58 = 1;
        goto LAB_0024eae7;
      }
    }
    else {
      pcVar8 = *(char **)(&(arguments.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_dataplus +
                         (long)local_44 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,pcVar8,(allocator<char> *)((long)&i_1 + 7));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_40,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 7));
    }
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_40);
  if (bVar2) {
    PrintHelpText(this);
    this_local._4_4_ = PARSE_ARGUMENT_DONE_AND_EXIT;
    local_58 = 1;
    goto LAB_0024eae7;
  }
  for (name.field_2._8_8_ = 0;
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_40), (ulong)name.field_2._8_8_ < sVar7;
      name.field_2._8_8_ = name.field_2._8_8_ + 1) {
    std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_40,name.field_2._8_8_);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    bVar2 = ParseArgument(this,pcVar8,(string *)(value.field_2._M_local_buf + 8),(string *)local_c8)
    ;
    if (bVar2) {
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_40);
      if (name.field_2._8_8_ + 1 != sVar7) {
        pvVar9 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_40,name.field_2._8_8_ + 1);
        pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)pvVar9);
        if (*pcVar8 != '-') {
          name.field_2._8_8_ = name.field_2._8_8_ + 1;
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_40,name.field_2._8_8_);
          std::__cxx11::string::operator=((string *)local_c8,(string *)pvVar9);
          goto LAB_0024dfb5;
        }
      }
      poVar6 = std::operator<<((ostream *)&std::cerr,"Missing value for flag: ");
      poVar6 = std::operator<<(poVar6,(string *)(value.field_2._M_local_buf + 8));
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&value.field_2 + 8),"--decode");
      if (bVar2) {
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "To decode an unknown message, use --decode_raw.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
      this_local._4_4_ = PARSE_ARGUMENT_FAIL;
      local_58 = 1;
    }
    else {
LAB_0024dfb5:
      PVar5 = InterpretArgument(this,(string *)((long)&value.field_2 + 8),(string *)local_c8);
      if (PVar5 == PARSE_ARGUMENT_DONE_AND_CONTINUE) {
        local_58 = 0;
      }
      else {
        local_58 = 1;
        this_local._4_4_ = PVar5;
      }
    }
    std::__cxx11::string::~string((string *)local_c8);
    std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
    if (local_58 != 0) goto LAB_0024eae7;
  }
  bVar2 = false;
  iVar13 = absl::lts_20250127::container_internal::
           raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&this->plugin_parameters_);
  __end2.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)iVar13.ctrl_;
  iVar13 = absl::lts_20250127::container_internal::
           raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&this->plugin_parameters_);
  while( true ) {
    __end2.ctrl_ = (ctrl_t *)iVar13.field_1;
    kv = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)iVar13.ctrl_;
    bVar3 = absl::lts_20250127::container_internal::operator!=
                      ((iterator *)&__end2.field_1,(iterator *)&kv);
    if (!bVar3) break;
    local_100 = absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::iterator::operator*((iterator *)&__end2.field_1);
    iVar13 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
             ::find<std::__cxx11::string>
                       ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                         *)&this->plugins_,&local_100->first);
    local_110 = iVar13;
    iVar13 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)&this->plugins_);
    local_118 = iVar13.field_1;
    pcVar10 = iVar13.ctrl_;
    _auStack_120 = pcVar10;
    bVar3 = absl::lts_20250127::container_internal::operator!=(&local_110,(iterator *)auStack_120);
    if (!bVar3) {
      __range3._7_1_ = '\0';
      __end3 = std::
               vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
               ::begin(&this->output_directives_);
      d = (OutputDirective *)
          std::
          vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
          ::end(&this->output_directives_);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end3,(__normal_iterator<google::protobuf::compiler::CommandLineInterface::OutputDirective_*,_std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>_>
                                    *)&d);
        if (!bVar3) break;
        plugin_name.field_2._8_8_ =
             __gnu_cxx::
             __normal_iterator<google::protobuf::compiler::CommandLineInterface::OutputDirective_*,_std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>_>
             ::operator*(&__end3);
        if (((reference)plugin_name.field_2._8_8_)->generator == (CodeGenerator *)0x0) {
          auVar14 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)&this->plugin_prefix_);
          local_178 = auVar14;
          auVar14 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((string *)plugin_name.field_2._8_8_);
          local_180 = auVar14._8_8_;
          pcVar10 = auVar14._0_8_;
          plugin_prefix._M_str = pcVar10;
          plugin_prefix._M_len = local_178._8_8_;
          directive._M_str = in_R9;
          directive._M_len = local_180;
          local_188 = pcVar10;
          compiler::(anonymous_namespace)::PluginName_abi_cxx11_
                    ((string *)local_168,(_anonymous_namespace_ *)local_178._0_8_,plugin_prefix,
                     directive);
          _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_168,&local_100->first);
          if (_Var4) {
            __range3._7_1_ = '\x01';
            local_58 = 10;
          }
          else {
            local_58 = 0;
          }
          std::__cxx11::string::~string((string *)local_168);
          if (local_58 != 0) break;
        }
        __gnu_cxx::
        __normal_iterator<google::protobuf::compiler::CommandLineInterface::OutputDirective_*,_std::vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>_>
        ::operator++(&__end3);
      }
      ppVar1 = local_100;
      b = (AlphaNum *)CONCAT71((int7)((ulong)pcVar10 >> 8),__range3._7_1_);
      local_209 = 0;
      local_362 = false;
      if (__range3._7_1_ == '\0') {
        absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                  (&local_1d8,&this->plugin_prefix_);
        absl::lts_20250127::AlphaNum::AlphaNum(&local_208,"gen-cpp");
        absl::lts_20250127::StrCat_abi_cxx11_(&local_1a8,(lts_20250127 *)&local_1d8,&local_208,b);
        local_209 = 1;
        local_362 = std::operator!=(&ppVar1->first,&local_1a8);
      }
      if ((local_209 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      if (local_362 != false) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Unknown flag: ");
        poVar6 = std::operator<<(poVar6,"--");
        ppVar1 = local_100;
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_230,(ulong)ppVar1);
        poVar6 = std::operator<<(poVar6,local_230);
        poVar6 = std::operator<<(poVar6,"_opt");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string(local_230);
        bVar2 = true;
      }
    }
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::iterator::operator++((iterator *)&__end2.field_1);
    iVar13.field_1.slot_ = (slot_type *)__end2.ctrl_;
    iVar13.ctrl_ = (ctrl_t *)kv;
  }
  if (bVar2) {
    this_local._4_4_ = PARSE_ARGUMENT_FAIL;
    local_58 = 1;
    goto LAB_0024eae7;
  }
  bVar2 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty(&this->proto_path_);
  if (bVar2) {
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->descriptor_set_in_names_);
    if (bVar2) {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[1],_const_char_(&)[2],_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_270,(char (*) [1])0x718c70,(char (*) [2])0x79fdf5);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::push_back(&this->proto_path_,(value_type *)local_270);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_270);
    }
  }
  local_271 = false;
  switch(this->mode_) {
  case MODE_COMPILE:
    local_271 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&this->input_files_);
    break;
  case MODE_DECODE:
    uVar12 = std::__cxx11::string::empty();
    if ((uVar12 & 1) != 0) {
      bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->input_files_);
      if (bVar2) {
        bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&this->descriptor_set_in_names_);
        if (bVar2) {
          local_271 = false;
          break;
        }
      }
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               "When using --decode_raw, no input files should be given.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      this_local._4_4_ = PARSE_ARGUMENT_FAIL;
      local_58 = 1;
      goto LAB_0024eae7;
    }
  case MODE_ENCODE:
  case MODE_PRINT:
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->input_files_);
    local_3b9 = false;
    if (bVar2) {
      local_3b9 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::empty(&this->descriptor_set_in_names_);
    }
    local_271 = local_3b9;
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface.cc"
               ,0x777);
    pLVar11 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_288);
    pLVar11 = absl::lts_20250127::log_internal::LogMessage::operator<<
                        (pLVar11,(char (*) [18])"Unexpected mode: ");
    pLVar11 = absl::lts_20250127::log_internal::LogMessage::
              operator<<<google::protobuf::compiler::CommandLineInterface::Mode,_0>
                        (pLVar11,&this->mode_);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_272,pLVar11);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_288);
  }
  if (local_271 == false) {
    if (this->mode_ == MODE_COMPILE) {
      bVar2 = std::
              vector<google::protobuf::compiler::CommandLineInterface::OutputDirective,_std::allocator<google::protobuf::compiler::CommandLineInterface::OutputDirective>_>
              ::empty(&this->output_directives_);
      if (bVar2) {
        uVar12 = std::__cxx11::string::empty();
        if ((uVar12 & 1) != 0) {
          uVar12 = std::__cxx11::string::empty();
          if ((uVar12 & 1) != 0) {
            poVar6 = std::operator<<((ostream *)&std::cerr,"Missing output directives.");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            this_local._4_4_ = PARSE_ARGUMENT_FAIL;
            local_58 = 1;
            goto LAB_0024eae7;
          }
        }
      }
    }
    if (this->mode_ != MODE_COMPILE) {
      uVar12 = std::__cxx11::string::empty();
      if ((uVar12 & 1) == 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "Can only use --dependency_out=FILE when generating code.");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        this_local._4_4_ = PARSE_ARGUMENT_FAIL;
        local_58 = 1;
        goto LAB_0024eae7;
      }
    }
    if ((this->mode_ == MODE_ENCODE) || ((this->deterministic_output_ & 1U) == 0)) {
      uVar12 = std::__cxx11::string::empty();
      if ((uVar12 & 1) == 0) {
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->input_files_);
        if (1 < sVar7) {
          poVar6 = std::operator<<((ostream *)&std::cerr,
                                   "Can only process one input file when using --dependency_out=FILE."
                                  );
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          this_local._4_4_ = PARSE_ARGUMENT_FAIL;
          local_58 = 1;
          goto LAB_0024eae7;
        }
      }
      if ((this->imports_in_descriptor_set_ & 1U) != 0) {
        uVar12 = std::__cxx11::string::empty();
        if ((uVar12 & 1) != 0) {
          poVar6 = std::operator<<((ostream *)&std::cerr,
                                   "--include_imports only makes sense when combined with --descriptor_set_out."
                                  );
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
      }
      if ((this->source_info_in_descriptor_set_ & 1U) != 0) {
        uVar12 = std::__cxx11::string::empty();
        if ((uVar12 & 1) != 0) {
          poVar6 = std::operator<<((ostream *)&std::cerr,
                                   "--include_source_info only makes sense when combined with --descriptor_set_out."
                                  );
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
      }
      if ((this->retain_options_in_descriptor_set_ & 1U) != 0) {
        uVar12 = std::__cxx11::string::empty();
        if ((uVar12 & 1) != 0) {
          poVar6 = std::operator<<((ostream *)&std::cerr,
                                   "--retain_options only makes sense when combined with --descriptor_set_out."
                                  );
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
      }
      this_local._4_4_ = PARSE_ARGUMENT_DONE_AND_CONTINUE;
      local_58 = 1;
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cerr,
                               "Can only use --deterministic_output with --encode.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      this_local._4_4_ = PARSE_ARGUMENT_FAIL;
      local_58 = 1;
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Missing input file.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = PARSE_ARGUMENT_FAIL;
    local_58 = 1;
  }
LAB_0024eae7:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return this_local._4_4_;
}

Assistant:

CommandLineInterface::ParseArgumentStatus CommandLineInterface::ParseArguments(
    int argc, const char* const argv[]) {
  executable_name_ = argv[0];

  std::vector<std::string> arguments;
  for (int i = 1; i < argc; ++i) {
    if (argv[i][0] == '@') {
      if (!ExpandArgumentFile(argv[i] + 1, &arguments)) {
        std::cerr << "Failed to open argument file: " << (argv[i] + 1)
                  << std::endl;
        return PARSE_ARGUMENT_FAIL;
      }
      continue;
    }
    arguments.push_back(argv[i]);
  }

  // if no arguments are given, show help
  if (arguments.empty()) {
    PrintHelpText();
    return PARSE_ARGUMENT_DONE_AND_EXIT;  // Exit without running compiler.
  }

  // Iterate through all arguments and parse them.
  for (size_t i = 0; i < arguments.size(); ++i) {
    std::string name, value;

    if (ParseArgument(arguments[i].c_str(), &name, &value)) {
      // Returned true => Use the next argument as the flag value.
      if (i + 1 == arguments.size() || arguments[i + 1][0] == '-') {
        std::cerr << "Missing value for flag: " << name << std::endl;
        if (name == "--decode") {
          std::cerr << "To decode an unknown message, use --decode_raw."
                    << std::endl;
        }
        return PARSE_ARGUMENT_FAIL;
      } else {
        ++i;
        value = arguments[i];
      }
    }

    ParseArgumentStatus status = InterpretArgument(name, value);
    if (status != PARSE_ARGUMENT_DONE_AND_CONTINUE) return status;
  }

  // Make sure each plugin option has a matching plugin output.
  bool foundUnknownPluginOption = false;
  for (const auto& kv : plugin_parameters_) {
    if (plugins_.find(kv.first) != plugins_.end()) {
      continue;
    }
    bool foundImplicitPlugin = false;
    for (const auto& d : output_directives_) {
      if (d.generator == nullptr) {
        // Infers the plugin name from the plugin_prefix_ and output directive.
        std::string plugin_name = PluginName(plugin_prefix_, d.name);

        // Since plugin_parameters_ is also inferred from --xxx_opt, we check
        // that it actually matches the plugin name inferred from --xxx_out.
        if (plugin_name == kv.first) {
          foundImplicitPlugin = true;
          break;
        }
      }
    }

    // This is a special case for cc_plugin invocations that are only with
    // "--cpp_opt" but no "--cpp_out". In this case, "--cpp_opt" only serves
    // as passing the arguments to cc_plugins, and no C++ generator is required
    // to be present in the invocation. We didn't have to skip for C++ generator
    // previously because the C++ generator was built-in.
    if (!foundImplicitPlugin &&
        kv.first != absl::StrCat(plugin_prefix_, "gen-cpp")) {
      std::cerr << "Unknown flag: "
                // strip prefix + "gen-" and add back "_opt"
                << "--" << kv.first.substr(plugin_prefix_.size() + 4) << "_opt"
                << std::endl;
      foundUnknownPluginOption = true;
    }
  }
  if (foundUnknownPluginOption) {
    return PARSE_ARGUMENT_FAIL;
  }

  // The --proto_path & --descriptor_set_in flags both specify places to look
  // for proto files. If neither were given, use the current working directory.
  if (proto_path_.empty() && descriptor_set_in_names_.empty()) {
    // Don't use make_pair as the old/default standard library on Solaris
    // doesn't support it without explicit template parameters, which are
    // incompatible with C++0x's make_pair.
    proto_path_.push_back(std::pair<std::string, std::string>("", "."));
  }

  // Check error cases that span multiple flag values.
  bool missing_proto_definitions = false;
  switch (mode_) {
    case MODE_COMPILE:
      missing_proto_definitions = input_files_.empty();
      break;
    case MODE_DECODE:
      // Handle --decode_raw separately, since it requires that no proto
      // definitions are specified.
      if (codec_type_.empty()) {
        if (!input_files_.empty() || !descriptor_set_in_names_.empty()) {
          std::cerr
              << "When using --decode_raw, no input files should be given."
              << std::endl;
          return PARSE_ARGUMENT_FAIL;
        }
        missing_proto_definitions = false;
        break;  // only for --decode_raw
      }
      // --decode (not raw) is handled the same way as the rest of the modes.
      ABSL_FALLTHROUGH_INTENDED;
    case MODE_ENCODE:
    case MODE_PRINT:
      missing_proto_definitions =
          input_files_.empty() && descriptor_set_in_names_.empty();
      break;
    default:
      ABSL_LOG(FATAL) << "Unexpected mode: " << mode_;
  }
  if (missing_proto_definitions) {
    std::cerr << "Missing input file." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ == MODE_COMPILE && output_directives_.empty() &&
      descriptor_set_out_name_.empty() && edition_defaults_out_name_.empty()) {
    std::cerr << "Missing output directives." << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ != MODE_COMPILE && !dependency_out_name_.empty()) {
    std::cerr << "Can only use --dependency_out=FILE when generating code."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (mode_ != MODE_ENCODE && deterministic_output_) {
    std::cerr << "Can only use --deterministic_output with --encode."
              << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (!dependency_out_name_.empty() && input_files_.size() > 1) {
    std::cerr
        << "Can only process one input file when using --dependency_out=FILE."
        << std::endl;
    return PARSE_ARGUMENT_FAIL;
  }
  if (imports_in_descriptor_set_ && descriptor_set_out_name_.empty()) {
    std::cerr << "--include_imports only makes sense when combined with "
                 "--descriptor_set_out."
              << std::endl;
  }
  if (source_info_in_descriptor_set_ && descriptor_set_out_name_.empty()) {
    std::cerr << "--include_source_info only makes sense when combined with "
                 "--descriptor_set_out."
              << std::endl;
  }
  if (retain_options_in_descriptor_set_ && descriptor_set_out_name_.empty()) {
    std::cerr << "--retain_options only makes sense when combined with "
                 "--descriptor_set_out."
              << std::endl;
  }

  return PARSE_ARGUMENT_DONE_AND_CONTINUE;
}